

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.hpp
# Opt level: O0

bool __thiscall libtorrent::digest32<256L>::operator<(digest32<256L> *this,digest32<256L> *n)

{
  type_conflict4 tVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  const_type puVar4;
  array<unsigned_int,_8UL> *in_RCX;
  uint32_t rhs;
  uint32_t lhs;
  reference v;
  zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  __end0;
  zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  __begin0;
  combined_range<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
  *__range2;
  digest32<256L> *n_local;
  digest32<256L> *this_local;
  
  boost::range::combine<std::array<unsigned_int,8ul>const&,std::array<unsigned_int,8ul>const&>
            ((combined_range<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>
              *)&__begin0.m_iterator_tuple.super_type.tail,(range *)this,&n->m_number,in_RCX);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
           *)&__end0.m_iterator_tuple.super_type.tail);
  boost::iterator_range_detail::
  iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((iterator_range_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::iterators::incrementable_traversal_tag>
         *)&v.tail);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_long>
                        *)&__end0.m_iterator_tuple.super_type.tail,
                       (iterator_facade<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_long>
                        *)&v.tail);
    if (!tVar1) {
      return false;
    }
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
                 *)&rhs);
    puVar4 = boost::tuples::
             get<0,unsigned_int_const&,boost::tuples::cons<unsigned_int_const&,boost::tuples::null_type>>
                       ((cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>
                         *)&rhs);
    uVar2 = libtorrent::aux::network_to_host(*puVar4);
    puVar4 = boost::tuples::
             get<1,unsigned_int_const&,boost::tuples::cons<unsigned_int_const&,boost::tuples::null_type>>
                       ((cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>
                         *)&rhs);
    uVar3 = libtorrent::aux::network_to_host(*puVar4);
    if (uVar2 < uVar3) break;
    if (uVar3 < uVar2) {
      return false;
    }
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::zip_iterator<boost::tuples::tuple<const_unsigned_int_*,_const_unsigned_int_*,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_boost::iterators::random_access_traversal_tag,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::cons<const_unsigned_int_&,_boost::tuples::null_type>_>,_long,_false,_false>
                  *)&__end0.m_iterator_tuple.super_type.tail);
  }
  return true;
}

Assistant:

bool operator<(digest32 const& n) const noexcept
		{
			for (auto const v : boost::combine(m_number, n.m_number))
			{
				std::uint32_t const lhs = aux::network_to_host(boost::get<0>(v));
				std::uint32_t const rhs = aux::network_to_host(boost::get<1>(v));
				if (lhs < rhs) return true;
				if (lhs > rhs) return false;
			}
			return false;
		}